

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O1

string * __thiscall
TokenScanner::scanString_abi_cxx11_(string *__return_storage_ptr__,TokenScanner *this)

{
  bool bVar1;
  string *psVar2;
  char cVar3;
  int iVar4;
  bool bVar5;
  string token;
  long *local_78;
  long local_70;
  long local_68 [2];
  string local_58;
  string *local_38;
  
  local_78 = local_68;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  cVar3 = std::istream::get();
  std::__cxx11::string::push_back((char)&local_78);
  bVar5 = false;
  do {
    iVar4 = std::istream::get();
    if (iVar4 == -1) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"TokenScanner found unterminated string","");
      error(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if ((iVar4 != cVar3) || (bVar5)) {
      std::__cxx11::string::push_back((char)&local_78);
      bVar5 = (bool)(bVar5 ^ 1);
      if (iVar4 != 0x5c) {
        bVar5 = false;
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    psVar2 = local_38;
  } while (bVar1);
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_38,local_78,local_70 + (long)local_78);
  std::__cxx11::string::_M_replace_aux((ulong)psVar2,psVar2->_M_string_length,0,'\x01');
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return psVar2;
}

Assistant:

string TokenScanner::scanString() {
   string token = "";
   char delim = isp->get();
   token += delim;
   bool escape = false;
   while (true) {
      int ch = isp->get();
      if (ch == EOF) error("TokenScanner found unterminated string");
      if (ch == delim && !escape) break;
      escape = (ch == '\\') && !escape;
      token += ch;
   }
   return token + delim;
}